

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_alignment.c
# Opt level: O2

void fsnav_ins_alignment_rotating(void)

{
  double __x;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  fsnav_struct *pfVar4;
  double dVar5;
  char cVar6;
  char *__nptr;
  long lVar7;
  fsnav_imu *pfVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  double (*padVar14) [6];
  ulong uVar15;
  long lVar16;
  double (*x) [3];
  long lVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  char t1_token [10];
  
  pfVar4 = fsnav;
  builtin_strncpy(t1_token,"alignment",10);
  pfVar8 = fsnav->imu;
  if (pfVar8 == (fsnav_imu *)0x0) {
    return;
  }
  if (fsnav->mode != 0) {
    if (fsnav->mode < 0) {
      return;
    }
    dVar20 = pfVar8->t;
    if (fsnav_ins_alignment_rotating::t1 < dVar20) {
      return;
    }
    (pfVar8->sol).L_valid = '\0';
    (pfVar8->sol).q_valid = '\0';
    (pfVar8->sol).rpy_valid = '\0';
    if (pfVar8->w_valid == '\0') {
      return;
    }
    if (pfVar8->f_valid == '\0') {
      return;
    }
    cVar6 = (pfVar8->sol).llh_valid;
    if ((cVar6 == '\0') && ((pfVar4->sol).llh_valid == '\0')) {
      return;
    }
    if (0.0 <= fsnav_ins_alignment_rotating::t_prev) {
      dVar21 = dVar20 - fsnav_ins_alignment_rotating::t_prev;
      if (dVar21 <= 0.0) {
        return;
      }
      fsnav_ins_alignment_rotating::t_shift = dVar20 - fsnav_ins_alignment_rotating::t0;
      __x = fsnav_ins_alignment_rotating::t_shift * (pfVar4->imu_const).u;
      fsnav_ins_alignment_rotating::t_prev = dVar20;
      dVar1 = sin(__x);
      dVar2 = cos(__x);
      fsnav_linal_mmul1T(fsnav_ins_alignment_rotating::fz0,fsnav_ins_alignment_rotating::Azz0,
                         fsnav->imu->f,3,3,1);
      auVar22._0_8_ = 1.0 - dVar2;
      dVar20 = (fsnav->imu_const).u;
      auVar22._8_8_ = dVar1;
      auVar3._8_8_ = dVar20;
      auVar3._0_8_ = dVar20 * dVar20;
      fsnav_ins_alignment_rotating::hx._0_16_ = divpd(auVar22,auVar3);
      fsnav_ins_alignment_rotating::hx[2] = fsnav_ins_alignment_rotating::t_shift;
      x = fsnav_ins_alignment_rotating::x;
      padVar14 = fsnav_ins_alignment_rotating::Sx;
      for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
        dVar20 = *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar13) * dVar21 +
                 *(double *)((long)fsnav_ins_alignment_rotating::vz0 + lVar13);
        *(double *)((long)fsnav_ins_alignment_rotating::vz0 + lVar13) = dVar20;
        cVar6 = fsnav_linal_check_measurement_residual
                          (*x,*padVar14,dVar20,fsnav_ins_alignment_rotating::hx,1.0,3.0,3);
        if (cVar6 != '\0') {
          fsnav_linal_kalman_update
                    (*x,*padVar14,fsnav_ins_alignment_rotating::Kx,
                     *(double *)((long)fsnav_ins_alignment_rotating::vz0 + lVar13),
                     fsnav_ins_alignment_rotating::hx,1.0,3);
        }
        dVar20 = (*x)[1];
        dVar23 = (*x)[2];
        *(double *)((long)fsnav_ins_alignment_rotating::fz0a0 + lVar13) = dVar20 + dVar23;
        *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar13) =
             dVar20 * dVar2 + ((*x)[0] * dVar1) / (fsnav->imu_const).u + dVar23;
        x = x + 1;
        padVar14 = padVar14 + 1;
      }
      fsnav_linal_mmul(fsnav_ins_alignment_rotating::fza,fsnav_ins_alignment_rotating::Azz0,
                       fsnav_ins_alignment_rotating::fz0,3,3,1);
      dVar20 = fsnav_linal_vnorm(fsnav_ins_alignment_rotating::fza,3);
      if (0.0 < dVar20) {
        for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
          *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar13) =
               *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar13) / dVar20;
        }
      }
      fsnav_linal_mmul(fsnav_ins_alignment_rotating::fz0,fsnav_ins_alignment_rotating::Azz0,
                       fsnav_ins_alignment_rotating::fz0a0,3,3,1);
      dVar20 = fsnav_linal_vnorm(fsnav_ins_alignment_rotating::fz0,3);
      if (0.0 < dVar20) {
        for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
          *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar13) =
               *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar13) / dVar20;
        }
      }
      fsnav_ins_alignment_rotating::C[0] = -dVar1;
      fsnav_ins_alignment_rotating::C[1] = auVar22._0_8_ * fsnav_ins_alignment_rotating::slt;
      fsnav_ins_alignment_rotating::C[2] =
           fsnav_ins_alignment_rotating::slt * fsnav_ins_alignment_rotating::slt +
           dVar2 * fsnav_ins_alignment_rotating::clt * fsnav_ins_alignment_rotating::clt;
      lVar13 = 0;
      for (lVar17 = 0; dVar20 = fsnav_ins_alignment_rotating::C[1], lVar17 != 0x18;
          lVar17 = lVar17 + 8) {
        lVar16 = lVar13 + 1;
        lVar9 = 0;
        if (lVar16 != 3) {
          lVar9 = lVar16;
        }
        dVar1 = fsnav_ins_alignment_rotating::fza[lVar9];
        lVar7 = lVar13 + -1;
        if (lVar13 == 0) {
          lVar7 = 2;
        }
        dVar2 = fsnav_ins_alignment_rotating::fza[lVar7];
        *(double *)((long)fsnav_ins_alignment_rotating::hy + lVar17) =
             (dVar1 * dVar1 + dVar2 * dVar2) * fsnav_ins_alignment_rotating::C[1];
        dVar5 = fsnav_ins_alignment_rotating::C[0];
        dVar23 = *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar17);
        fsnav_ins_alignment_rotating::hy[lVar9] =
             dVar2 * fsnav_ins_alignment_rotating::C[0] - dVar1 * dVar23 * dVar20;
        fsnav_ins_alignment_rotating::hy[lVar7] = -dVar1 * dVar5 - dVar2 * dVar23 * dVar20;
        dVar20 = *(double *)((long)fsnav_ins_alignment_rotating::fz0 + lVar17);
        dVar23 = dVar23 * fsnav_ins_alignment_rotating::C[2];
        dVar1 = sin(__x * 0.5);
        fsnav_linal_kalman_update
                  (fsnav_ins_alignment_rotating::y,fsnav_ins_alignment_rotating::Sy,
                   fsnav_ins_alignment_rotating::Ky,dVar1 * (dVar20 - dVar23),
                   fsnav_ins_alignment_rotating::hy,1.0,3);
        lVar13 = lVar16;
      }
      fsnav_linal_kalman_predict_I_qI(fsnav_ins_alignment_rotating::Sy,9.0 / dVar21,3);
      fsnav_linal_cross3x1
                (fsnav_ins_alignment_rotating::wf,fsnav_ins_alignment_rotating::y,
                 fsnav_ins_alignment_rotating::fza);
      dVar20 = fsnav_linal_vnorm(fsnav_ins_alignment_rotating::wf,3);
      if (dVar20 <= 0.0) {
        pfVar8 = fsnav->imu;
      }
      else {
        pdVar11 = fsnav_ins_alignment_rotating::L;
        for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
          *pdVar11 = *(double *)((long)fsnav_ins_alignment_rotating::wf + lVar13) / dVar20;
          pdVar11 = pdVar11 + 3;
        }
        fsnav_linal_cross3x1
                  (fsnav_ins_alignment_rotating::fwf,fsnav_ins_alignment_rotating::fza,
                   fsnav_ins_alignment_rotating::wf);
        pdVar10 = fsnav_ins_alignment_rotating::L;
        pdVar11 = fsnav_ins_alignment_rotating::L + 1;
        for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
          *pdVar11 = *(double *)((long)fsnav_ins_alignment_rotating::fwf + lVar13) / dVar20;
          pdVar11 = pdVar11 + 3;
        }
        pdVar11 = pdVar10 + 2;
        for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
          *pdVar11 = *(double *)((long)fsnav_ins_alignment_rotating::fza + lVar13);
          pdVar11 = pdVar11 + 3;
        }
        pfVar8 = fsnav->imu;
        (pfVar8->sol).L_valid = '\x01';
        fsnav_linal_mat2quat((pfVar8->sol).q,pdVar10);
        pfVar8 = fsnav->imu;
        (pfVar8->sol).q_valid = '\x01';
        fsnav_linal_mat2rpy((pfVar8->sol).rpy,fsnav_ins_alignment_rotating::L);
        pfVar8 = fsnav->imu;
        (pfVar8->sol).rpy_valid = '\x01';
      }
      for (lVar13 = 0; lVar13 != 0x18; lVar13 = lVar13 + 8) {
        *(double *)((long)fsnav_ins_alignment_rotating::a + lVar13) =
             *(double *)((long)pfVar8->w + lVar13) * dVar21;
      }
      fsnav_linal_eul2mat(fsnav_ins_alignment_rotating::C,fsnav_ins_alignment_rotating::a);
      pdVar11 = fsnav_ins_alignment_rotating::Azz0;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        pdVar10 = pdVar11;
        for (lVar17 = 0; lVar17 != 0x18; lVar17 = lVar17 + 8) {
          *(double *)((long)fsnav_ins_alignment_rotating::a + lVar17) = *pdVar10;
          pdVar10 = pdVar10 + 3;
        }
        pdVar10 = fsnav_ins_alignment_rotating::C;
        for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
          dVar20 = 0.0;
          for (lVar16 = 0; lVar16 != 0x18; lVar16 = lVar16 + 8) {
            dVar20 = dVar20 + *(double *)((long)pdVar10 + lVar16) *
                              *(double *)((long)fsnav_ins_alignment_rotating::a + lVar16);
          }
          fsnav_ins_alignment_rotating::Azz0[lVar17 * 3 + lVar13] = dVar20;
          pdVar10 = pdVar10 + 3;
        }
        pdVar11 = pdVar11 + 1;
      }
      pfVar8 = fsnav->imu;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        (pfVar8->sol).v[lVar13] = 0.0;
      }
      (pfVar8->sol).v_valid = '\x01';
      return;
    }
    pdVar11 = fsnav_ins_alignment_rotating::Azz0;
    fsnav_ins_alignment_rotating::t_prev = dVar20;
    fsnav_ins_alignment_rotating::t0 = dVar20;
    for (uVar12 = 0; uVar12 != 9; uVar12 = uVar12 + 1) {
      dVar20 = 1.0;
      if ((uVar12 & 3) != 0) {
        dVar20 = 0.0;
      }
      *pdVar11 = dVar20;
      pdVar11 = pdVar11 + 1;
    }
    padVar14 = fsnav_ins_alignment_rotating::Sx;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      fsnav_ins_alignment_rotating::vz0[lVar13] = 0.0;
      uVar12 = 0;
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        fsnav_ins_alignment_rotating::x[lVar13][lVar17] = 0.0;
        fsnav_ins_alignment_rotating::Sx[lVar13][uVar12] = 9000000000.0;
        lVar16 = uVar12 - lVar17;
        uVar15 = uVar12;
        while (uVar12 = uVar15 + 1, uVar12 < lVar16 + 3U) {
          (*padVar14)[uVar15 + 1] = 0.0;
          uVar15 = uVar12;
        }
      }
      padVar14 = padVar14 + 1;
    }
    uVar12 = 0;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      fsnav_ins_alignment_rotating::y[lVar13] = 0.0;
      fsnav_ins_alignment_rotating::Sy[uVar12] = 9000000000.0;
      lVar17 = uVar12 - lVar13;
      while (uVar12 = uVar12 + 1, uVar12 < lVar17 + 3U) {
        fsnav_ins_alignment_rotating::Sy[uVar12] = 0.0;
      }
    }
    if (cVar6 == '\0') {
      if ((pfVar4->sol).llh_valid == '\0') {
        return;
      }
      fsnav_ins_alignment_rotating::slt = sin((pfVar4->sol).llh[1]);
      dVar20 = (fsnav->sol).llh[1];
      uVar18 = SUB84(dVar20,0);
      uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
    }
    else {
      fsnav_ins_alignment_rotating::slt = sin((pfVar8->sol).llh[1]);
      dVar20 = (fsnav->imu->sol).llh[1];
      uVar18 = SUB84(dVar20,0);
      uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
    }
    fsnav_ins_alignment_rotating::clt = cos((double)CONCAT44(uVar19,uVar18));
    return;
  }
  fsnav_ins_alignment_rotating::t_shift = 0.0;
  fsnav_ins_alignment_rotating::t_prev = -1.0;
  fsnav_ins_alignment_rotating::t0 = -1.0;
  __nptr = fsnav_locate_token(t1_token,pfVar8->cfg,pfVar8->cfglength,'=');
  if (__nptr != (char *)0x0) {
    dVar20 = atof(__nptr);
    uVar18 = SUB84(dVar20,0);
    uVar19 = (undefined4)((ulong)dVar20 >> 0x20);
    if (0.0 < dVar20) goto LAB_001036db;
  }
  uVar18 = 0;
  uVar19 = 0x408c2000;
LAB_001036db:
  fsnav_ins_alignment_rotating::L = (fsnav->imu->sol).L;
  fsnav_ins_alignment_rotating::t1 = (double)CONCAT44(uVar19,uVar18);
  return;
}

Assistant:

void fsnav_ins_alignment_rotating(void) {

	const char   
		t1_token[] = "alignment"; // alignment duration parameter name in configuration
	const double 
		t1_default = 900,         // default alignment duration
		v_std      = 1,           // velocity integral standard deviation
		S0         = 9e9,         // starting covariances
		q2_std     = 9;           // Earth rotation axis ort variance, rad^2/Hz
	const size_t 
		m      = 3;	              // approximation coefficient count

	static double 
		*L		= NULL, // pointer to attitude matrix in solution
		t1      = -1,   // alignment duration
		t_prev  = -1,   // previous time
		t0      = -1,   // alignment start time
		t_shift =  0,   // time since the alignment started
		slt     =  0,   //   sine of latitude
		clt     =  0,   // cosine of latitude
		fz0  [3],       // accelerometers output and their approximation in inertial frame
		vz0  [3],       // velocity integral
		fz0a0[3],       // approximation at t0
		fza  [3],       // approximation at current time in instrumental frame
		a    [3],       // Euler vector of rotation from inertial to instrumental reference frame
		C    [9],       // intermediate transition matrix
		Azz0 [9],       // transition matrix from inertial to instrumental reference frame
		x    [3][3],    // approximation coefficients
		 Sx  [3][6],    // upper-triangular part of Colesky factorization of approximation coefficients covariance
		 Kx  [3],       // approximation Kalman gain
		 hx  [3],       // approximation model matrix
		  y  [3],       // Earth rotation axis ort estimate
		 Sy  [6],       // upper-triangular part of Colesky factorization of Earth rotation axis ort covariance
		 hy  [3],       // Earth rotation axis ort model matrix
		 Ky  [3],       // Earth rotation axis ort Kalman gain
		 wf  [3],       // first column of attitude matrix
		fwf  [3];       // second column of attitude matrix
					    
	double 			    
		   dt,          // time increment
		   ut,          // Earth rotation angle
		  sut, cut,     // sine and cosine of Earth rotation angle
		  n,            // vector norm
		  q2;           // Earth rotation axis ort variance, rad^2
	char *cfg_ptr;      // pointer to a substring in configuration
	size_t 			    
		  i, j, k, k0;  // common indexing variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// reset time variables
		t_prev  = -1;
		t0      = -1;
		t_shift =  0;
		// parse alignment duration from configuration string
		cfg_ptr = fsnav_locate_token(t1_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t1 = atof(cfg_ptr);		
		// if not found or invalid, set to default
		if (cfg_ptr == NULL || t1 <= 0)
			t1 = t1_default;
		// set matrix pointer to imu->sol
		L = fsnav->imu->sol.L;

	}

	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}

	else						// main cycle
	{
		// check if alignment duration exceeded 
		if (fsnav->imu->t > t1)
			return;
		// drop validity flags
		fsnav->imu->sol.L_valid		= 0;
		fsnav->imu->sol.q_valid		= 0;
		fsnav->imu->sol.rpy_valid	= 0;
		// check for crucial data present
		if (   !fsnav->imu->      w_valid     // check if angular rate measurements are available
			|| !fsnav->imu->      f_valid     // check if accelerometer measurements are available
			|| (   !fsnav->imu->sol.llh_valid // check if imu coordinates are available
			    && !fsnav->     sol.llh_valid // check if hybrid solution coordinates are available
			   )
			)
			return;
		// starting procedures
		if (t_prev < 0) {
			// time init
			t_prev = fsnav->imu->t;
			t0     = fsnav->imu->t;
			// identity attitude matrix
			for (i = 0; i < 9; i++)
				Azz0[i] = (i%4 == 0) ? 1 : 0;
			// component-wise init
			for (i = 0; i < 3; i++) {
				// velocity integral
				vz0[i] = 0;
				// starting estimates and covariances for approximation
				for (j = 0, k = 0; j < m; j++) {
					 x[i][j] = 0;
					Sx[i][k] = S0;
					k0 = k + m - j;
					for (k++; k < k0; k++) Sx[i][k] = 0;
				}
			}
			// starting estimates and covariances for Earth rotation axis ort
			for (j = 0, k = 0; j < 3; j++) {
				 y[j] = 0;
				Sy[k] = S0;
				k0 = k + 3 - j;
				for (k++; k < k0; k++) Sy[k] = 0;
			}
			// latitude
			if (fsnav->imu->sol.llh_valid) { // if imu coordinates are available
				slt    = sin(fsnav->imu->sol.llh[1]);
				clt    = cos(fsnav->imu->sol.llh[1]);
			}
			else if (fsnav->sol.llh_valid) { // if hybrid solution coordinates are available
				slt    = sin(fsnav->     sol.llh[1]);
				clt    = cos(fsnav->     sol.llh[1]);
			}
			return;
		}
		// time increments
		dt      = fsnav->imu->t - t_prev; 
		if (dt <= 0) return; // invalid increment, aborting
		t_prev  = fsnav->imu->t;
		t_shift = fsnav->imu->t - t0;
		q2 = q2_std/dt;
		// Earth rotation angle
		 ut = fsnav->imu_const.u*t_shift;
		sut = sin(ut);
		cut = cos(ut);
		// transforming into inertial frame fz0 = A^T*fz
		fsnav_linal_mmul1T(fz0, Azz0, fsnav->imu->f, 3, 3, 1);
		// approximation model coefficients
		hx[0] = (1 - cut)/(fsnav->imu_const.u*fsnav->imu_const.u);  
		hx[1] =   sut    / fsnav->imu_const.u;  
		hx[2] = t_shift;
		// approximation
		for (i = 0; i < 3; i++) {
			// velocity interal update
			vz0[i] += fz0[i]*dt;
			// approiximation coefficient estimates
			if (fsnav_linal_check_measurement_residual(x[i],Sx[i], vz0[i],hx,v_std, 3.0, m)) // check measurement residual within 3-sigma with current estimate
				fsnav_linal_kalman_update(x[i],Sx[i],Kx, vz0[i],hx,v_std, m);                // update estimates using v = h*x + dv, v_std = sqrt(E[dv^2])
			// approximation at t0 in inertial frame
			fz0a0[i] = x[i][1] + x[i][2];
			// approximation at t  in inertial frame
			fz0[i] = x[i][0]*sut/fsnav->imu_const.u + x[i][1]*cut + x[i][2];
		}
		// transition to instrumental frame (fza = Azz0*fz0) and normalization
		fsnav_linal_mmul(fza , Azz0, fz0 , 3, 3, 1);
		n = fsnav_linal_vnorm(fza,3);                    // n = |fza|
		if (n > 0) for (i = 0; i < 3; i++) fza[i] /= n; // normalization
		fsnav_linal_mmul(fz0, Azz0, fz0a0, 3, 3, 1);
		n = fsnav_linal_vnorm(fz0,3);                    // n = |fz0|
		if (n > 0) for (i = 0; i < 3; i++) fz0[i] /= n; // normalization
		// estimating Earth rotation axis ort
		C[0] =        - sut;
		C[1] = slt*(1 - cut);
		C[2] = slt*slt + clt*clt*cut;
		for (i = 0; i < 3; i++) {
			// H = (w x f)*C_13 + [f x (w x f)]*C_23
			hy[(i+0)%3] = (fza[(i+1)%3]*fza[(i+1)%3] + fza[(i+2)%3]*fza[(i+2)%3])*C[1];
			hy[(i+1)%3] =  fza[(i+2)%3]*C[0]         - fza[(i+0)%3]*fza[(i+1)%3] *C[1];
			hy[(i+2)%3] = -fza[(i+1)%3]*C[0]         - fza[(i+0)%3]*fza[(i+2)%3] *C[1];
			fsnav_linal_kalman_update(y,Sy,Ky, (fz0[i]-fza[i]*C[2])*sin(ut/2),hy,1, 3); // update estimate using z = [fza0 - fza*C_33], z = H*y + r, M[r^2] = 1
		}
		// Kalman prediction step, identity transition, diagonal system noise covariance
		fsnav_linal_kalman_predict_I_qI(Sy,q2,3); // P = S*S^T, P_ii = P_ii + q^2, S = chol(P)
		// renew attitude matrix: L = [ (w x f)/|w x f| , (f x (w x f))/(|f||w x f|) , f/|f| ]
		fsnav_linal_cross3x1( wf, y,fza); //  wf =      w x f
		n = fsnav_linal_vnorm(wf,3);      //   n =     |w x f|
		if (n > 0) {
			for (i = 0; i < 3; i++) L[i*3+0] =  wf[i]/n; // L1 =      (w x f) /    |w x f|
			fsnav_linal_cross3x1(fwf,fza,wf); // fwf = f x (w x f)
			for (i = 0; i < 3; i++) L[i*3+1] = fwf[i]/n; // L2 = (f x (w x f))/(|f||w x f|)
			for (i = 0; i < 3; i++) L[i*3+2] = fza[i];   // L3 =           f  / |f|
			fsnav->imu->sol.L_valid = 1;
			// renew quaternion
			fsnav_linal_mat2quat(fsnav->imu->sol.q ,L);
			fsnav->imu->sol.q_valid   = 1;
			// renew angles: roll, pitch and yaw=true heading
			fsnav_linal_mat2rpy(fsnav->imu->sol.rpy,L);
			fsnav->imu->sol.rpy_valid = 1;
		}
		// instrumental frame update: Azz0(t+dt) = (E + [w x]*sin(|w*dt|)/|w| + [w x]^2*(1-cos(|w*dt|)/|w*dt|^2)*Azz0(t) - Rodrigues' rotation formula
		for (i = 0; i < 3; i++)
			a[i] = fsnav->imu->w[i]*dt; // a = w*dt
		fsnav_linal_eul2mat(C,a);       // C = E + [a x]*sin(|a|)/|a| + [a x]^2*(1-cos(|a|)/|a|^2
		for (i = 0; i < 3; i++) {      // matrix multiplication overwriting Azz0
			for (j = 0; j < 3; j++)
				a[j] = Azz0[j*3+i];    // i-th column of Azz0 previous value
			for (j = 0; j < 3; j++)
				for (k = 0, Azz0[j*3+i] = 0; k < 3; k++)
					Azz0[j*3+i] += C[j*3+k]*a[k]; // replace column with matrix product: Azz0(t+dt) = C*Azz0(t)
		}
		// set velocity equal to zero, with no better information at initial alignment phase
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
	}

}